

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGlyphs.cpp
# Opt level: O1

void __thiscall chrono::ChGlyphs::ArchiveIN(ChGlyphs *this,ChArchiveIn *marchive)

{
  eCh_GlyphType_mapper mmapper;
  eCh_GlyphType_mapper local_80;
  ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType> local_60;
  char *local_40;
  ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType> *local_38;
  undefined1 local_30;
  
  ChArchiveIn::VersionRead<chrono::ChGlyphs>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.value_ptr =
       (eCh_GlyphType *)&this->points;
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0xa13a1a;
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = '\0';
  ChArchiveIn::in<chrono::ChVector<double>>
            (marchive,(ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
                       *)&local_80);
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.value_ptr =
       (eCh_GlyphType *)&this->colors;
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0xa0493b;
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = '\0';
  ChArchiveIn::in<chrono::ChColor>
            (marchive,(ChNameValue<std::vector<chrono::ChColor,_std::allocator<chrono::ChColor>_>_>
                       *)&local_80);
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.value_ptr =
       (eCh_GlyphType *)&this->vectors;
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0xa06ac4;
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = '\0';
  ChArchiveIn::in<chrono::ChVector<double>>
            (marchive,(ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
                       *)&local_80);
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.value_ptr =
       (eCh_GlyphType *)&this->rotations;
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0xa06acc;
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = '\0';
  ChArchiveIn::in<chrono::ChQuaternion<double>>
            (marchive,(ChNameValue<std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>_>
                       *)&local_80);
  eCh_GlyphType_mapper::eCh_GlyphType_mapper(&local_80);
  eCh_GlyphType_mapper::operator()(&local_60,&local_80,&this->draw_mode);
  local_40 = "draw_mode";
  local_30 = 0;
  local_38 = &local_60;
  (**(code **)(*(long *)marchive + 0x58))(marchive);
  local_60.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b692c8
  ;
  if (local_60.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_60.value_ptr = (eCh_GlyphType *)&this->size;
  local_60.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x98125c;
  local_60.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_60.value_ptr = (eCh_GlyphType *)&this->zbuffer_hide;
  local_60.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0xa06ae0;
  local_60.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive);
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b692c8;
  if (local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChGlyphs::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChGlyphs>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(points);
    marchive >> CHNVP(colors);
    marchive >> CHNVP(vectors);
    marchive >> CHNVP(rotations);
    eCh_GlyphType_mapper mmapper;
    marchive >> CHNVP(mmapper(draw_mode), "draw_mode");
    marchive >> CHNVP(size);
    marchive >> CHNVP(zbuffer_hide);
}